

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O0

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  Snapshot snapshot;
  cmCommandContext local_60;
  Snapshot local_28;
  cmLinkImplItem *local_10;
  cmLinkImplItem *this_local;
  
  local_10 = this;
  cmLinkItem::cmLinkItem(&this->super_cmLinkItem);
  cmState::Snapshot::Snapshot(&local_28,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_60);
  snapshot.Position.Tree = local_28.Position.Tree;
  snapshot.State = local_28.State;
  snapshot.Position.Position = local_28.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_60);
  cmCommandContext::~cmCommandContext(&local_60);
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}